

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O3

void Write(string *output,vector<TCacheReq,_std::allocator<TCacheReq>_> *reqs)

{
  pointer pTVar1;
  ostream *poVar2;
  TCacheReq *req;
  pointer pTVar3;
  ofstream out;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228,(string *)output,_S_out);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  pTVar1 = (reqs->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar3 = (reqs->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
                super__Vector_impl_data._M_start; pTVar3 != pTVar1; pTVar3 = pTVar3 + 1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  std::ofstream::close();
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void Write(const std::string& output, const std::vector<TCacheReq>& reqs) {
    std::ofstream out(output);
    out << reqs.size() << std::endl;
    for (const auto& req : reqs) {
        out << req.ServerId << " " << req.VideoId << std::endl;
    }
    out.close();
}